

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterXsYs<int>,_ImPlot::TransformerLinLin>::operator()
          (StairsRenderer<ImPlot::GetterXsYs<int>,_ImPlot::TransformerLinLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  ImVec2 IVar3;
  int iVar4;
  ImU32 IVar5;
  uint uVar6;
  GetterXsYs<int> *pGVar7;
  ImDrawVert *pIVar8;
  ImDrawIdx *pIVar9;
  bool bVar10;
  long lVar11;
  ImDrawIdx IVar12;
  ImVec2 IVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  pGVar7 = this->Getter;
  iVar4 = pGVar7->Count;
  lVar11 = (long)(((pGVar7->Offset + prim + 1) % iVar4 + iVar4) % iVar4) * (long)pGVar7->Stride;
  iVar4 = this->Transformer->YAxis;
  IVar13.x = (float)(((double)*(int *)((long)pGVar7->Xs + lVar11) -
                     (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                    (double)GImPlot->PixelRange[iVar4].Min.x);
  fVar14 = (float)(((double)*(int *)((long)pGVar7->Ys + lVar11) -
                   GImPlot->CurrentPlot->YAxis[iVar4].Range.Min) * GImPlot->My[iVar4] +
                  (double)GImPlot->PixelRange[iVar4].Min.y);
  fVar2 = (this->P1).x;
  fVar15 = (this->P1).y;
  fVar16 = fVar15;
  if (fVar14 <= fVar15) {
    fVar16 = fVar14;
  }
  bVar10 = false;
  if ((fVar16 < (cull_rect->Max).y) &&
     (fVar15 = (float)(-(uint)(fVar14 <= fVar15) & (uint)fVar15 |
                      ~-(uint)(fVar14 <= fVar15) & (uint)fVar14), pfVar1 = &(cull_rect->Min).y,
     bVar10 = false, *pfVar1 <= fVar15 && fVar15 != *pfVar1)) {
    fVar15 = fVar2;
    if (IVar13.x <= fVar2) {
      fVar15 = IVar13.x;
    }
    if (fVar15 < (cull_rect->Max).x) {
      fVar15 = (float)(~-(uint)(IVar13.x <= fVar2) & (uint)IVar13.x |
                      -(uint)(IVar13.x <= fVar2) & (uint)fVar2);
      bVar10 = (cull_rect->Min).x <= fVar15 && fVar15 != (cull_rect->Min).x;
    }
  }
  if (bVar10 != false) {
    fVar15 = (this->P1).y;
    fVar16 = fVar15 + this->HalfWeight;
    fVar15 = fVar15 - this->HalfWeight;
    IVar5 = this->Col;
    IVar3 = *uv;
    pIVar8 = DrawList->_VtxWritePtr;
    (pIVar8->pos).x = fVar2;
    (pIVar8->pos).y = fVar16;
    DrawList->_VtxWritePtr->uv = IVar3;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8->col = IVar5;
    pIVar8[1].pos.x = IVar13.x;
    pIVar8[1].pos.y = fVar15;
    DrawList->_VtxWritePtr[1].uv = IVar3;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[1].col = IVar5;
    pIVar8[2].pos.x = fVar2;
    pIVar8[2].pos.y = fVar15;
    pIVar8[2].uv = IVar3;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[2].col = IVar5;
    pIVar8[3].pos.x = IVar13.x;
    pIVar8[3].pos.y = fVar16;
    pIVar8[3].uv = IVar3;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar8 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    pIVar9 = DrawList->_IdxWritePtr;
    IVar12 = (ImDrawIdx)uVar6;
    *pIVar9 = IVar12;
    pIVar9[1] = IVar12 + 1;
    pIVar9[2] = IVar12 + 2;
    pIVar9[3] = IVar12;
    pIVar9[4] = IVar12 + 1;
    pIVar9[5] = IVar12 + 3;
    DrawList->_IdxWritePtr = pIVar9 + 6;
    DrawList->_VtxCurrentIdx = uVar6 + 4;
    fVar16 = IVar13.x - this->HalfWeight;
    fVar15 = this->HalfWeight + IVar13.x;
    fVar2 = (this->P1).y;
    IVar5 = this->Col;
    IVar3 = *uv;
    pIVar8[4].pos.x = fVar16;
    pIVar8[4].pos.y = fVar14;
    DrawList->_VtxWritePtr->uv = IVar3;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8->col = IVar5;
    pIVar8[1].pos.x = fVar15;
    pIVar8[1].pos.y = fVar2;
    DrawList->_VtxWritePtr[1].uv = IVar3;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[1].col = IVar5;
    pIVar8[2].pos.x = fVar16;
    pIVar8[2].pos.y = fVar2;
    pIVar8[2].uv = IVar3;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[2].col = IVar5;
    pIVar8[3].pos.x = fVar15;
    pIVar8[3].pos.y = fVar14;
    pIVar8[3].uv = IVar3;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar8 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    pIVar9 = DrawList->_IdxWritePtr;
    IVar12 = (ImDrawIdx)uVar6;
    *pIVar9 = IVar12;
    pIVar9[1] = IVar12 + 1;
    pIVar9[2] = IVar12 + 2;
    pIVar9[3] = IVar12;
    pIVar9[4] = IVar12 + 1;
    pIVar9[5] = IVar12 + 3;
    DrawList->_IdxWritePtr = pIVar9 + 6;
    DrawList->_VtxCurrentIdx = uVar6 + 4;
  }
  IVar13.y = fVar14;
  this->P1 = IVar13;
  return bVar10;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }